

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_uint8_vector_base64_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,int urlsafe)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  uint8_t *dst;
  int mode;
  uint8_t *puVar4;
  uint *puVar5;
  uint8_t *src;
  ulong uVar6;
  ulong uVar7;
  size_t data_len;
  ulong local_40;
  ulong local_38;
  
  mode = (int)len;
  uVar3 = id * 2 + 4;
  if ((uVar3 < (uint)td->vsize) &&
     (uVar6 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar3), uVar6 != 0)) {
    puVar5 = (uint *)(uVar6 + (long)td->table);
  }
  else {
    puVar5 = (uint *)0x0;
  }
  if (puVar5 != (uint *)0x0) {
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = ',';
    }
    print_name(ctx,name,len);
    uVar3 = *puVar5;
    local_40 = (ulong)*(uint *)((long)puVar5 + (ulong)uVar3);
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = '\"';
    uVar6 = (local_40 << 2) / 3 + 3 & 0xfffffffffffffffc;
    if (ctx->pflush <= ctx->p + uVar6) {
      (*ctx->flush)(ctx,0);
    }
    src = (uint8_t *)((long)puVar5 + (ulong)uVar3 + 4);
    puVar4 = (uint8_t *)ctx->pflush;
    dst = (uint8_t *)ctx->p;
    if (puVar4 < dst + uVar6) {
      do {
        uVar6 = (long)puVar4 - (long)dst & 0xfffffffffffffffc;
        if (uVar6 == 0) {
          __assert_fail("n > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                        ,0x13c,
                        "void print_uint8_vector_base64_object(flatcc_json_printer_t *, const void *, int)"
                       );
        }
        uVar7 = uVar6 * 3 >> 2;
        local_38 = uVar7;
        base64_encode(dst,src,&local_38,(size_t *)(ulong)(urlsafe != 0),mode);
        ctx->p = ctx->p + uVar6;
        src = src + uVar7;
        local_40 = local_40 - uVar7;
        (*ctx->flush)(ctx,0);
        uVar6 = (local_40 << 2) / 3 + 3 & 0x7ffffffffffffffc;
        puVar4 = (uint8_t *)ctx->pflush;
        dst = (uint8_t *)ctx->p;
      } while (puVar4 < dst + uVar6);
    }
    base64_encode(dst,src,&local_40,(size_t *)(ulong)(urlsafe != 0 | 0x80),mode);
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + uVar6 + 1;
    pcVar2[uVar6] = '\"';
  }
  return;
}

Assistant:

void flatcc_json_printer_uint8_vector_base64_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len, int urlsafe)
{
    const void *p = get_field_ptr(td, id);
    int mode;

    mode = urlsafe ? base64_mode_url : base64_mode_rfc4648;
    mode |= base64_enc_modifier_padding;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        print_name(ctx, name, len);
        print_uint8_vector_base64_object(ctx, read_uoffset_ptr(p), mode);
    }
}